

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

string * units::detail::testing::testUnitSequenceGeneration
                   (string *__return_storage_ptr__,double mul,string *test)

{
  string local_40;
  string *local_20;
  string *test_local;
  double mul_local;
  
  local_20 = test;
  test_local = (string *)mul;
  mul_local = (double)__return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_40,(string *)test);
  generateUnitSequence(__return_storage_ptr__,mul,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string
            testUnitSequenceGeneration(double mul, const std::string& test)
        {
            return generateUnitSequence(mul, test);
        }